

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffgkey(fitsfile *fptr,char *keyname,char *keyval,char *comm,int *status)

{
  int iVar1;
  char card [81];
  char acStack_78 [96];
  
  *keyval = '\0';
  if (comm != (char *)0x0) {
    *comm = '\0';
  }
  iVar1 = *status;
  if (iVar1 < 1) {
    iVar1 = ffgcrd(fptr,keyname,acStack_78,status);
    if (iVar1 < 1) {
      ffpsvc(acStack_78,keyval,comm,status);
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgkey( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,      /* I - name of keyword to read  */
            char *keyval,       /* O - keyword value            */
            char *comm,         /* O - keyword comment          */
            int  *status)       /* IO - error status            */
/*
  Read (get) the named keyword, returning the keyword value and comment.
  The value is just the literal string of characters in the value field
  of the keyword.  In the case of a string valued keyword, the returned
  value includes the leading and closing quote characters.  The value may be
  up to 70 characters long, and the comment may be up to 72 characters long.
  If the keyword has no value (no equal sign in column 9) then a null value
  is returned.
*/
{
    char card[FLEN_CARD];

    keyval[0] = '\0';
    if (comm)
       comm[0] = '\0';

    if (*status > 0)
        return(*status);

    if (ffgcrd(fptr, keyname, card, status) > 0)    /* get the 80-byte card */
        return(*status);

    ffpsvc(card, keyval, comm, status);      /* parse the value and comment */

    return(*status);
}